

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__io_stop(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if ((events & 0xffffdffa) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP))",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x362,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x363,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (w->fd != -1) {
    if (w->fd < 0) {
      __assert_fail("w->fd >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                    ,0x368,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if ((uint)w->fd < loop->nwatchers) {
      w->pevents = (events ^ 0xffffffff) & w->pevents;
      if (w->pevents == 0) {
        *(void **)w->watcher_queue[1] = w->watcher_queue[0];
        *(void **)((long)w->watcher_queue[0] + 8) = w->watcher_queue[1];
        w->watcher_queue[0] = w->watcher_queue;
        w->watcher_queue[1] = w->watcher_queue;
        if (loop->watchers[w->fd] != (uv__io_t *)0x0) {
          if (loop->watchers[w->fd] != w) {
            __assert_fail("loop->watchers[w->fd] == w",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                          ,0x375,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          if (loop->nfds == 0) {
            __assert_fail("loop->nfds > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                          ,0x376,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          loop->watchers[w->fd] = (uv__io_t *)0x0;
          loop->nfds = loop->nfds - 1;
          w->events = 0;
        }
      }
      else if (w->watcher_queue == (void **)w->watcher_queue[0]) {
        w->watcher_queue[0] = loop->watcher_queue;
        w->watcher_queue[1] = loop->watcher_queue[1];
        *(void ***)w->watcher_queue[1] = w->watcher_queue;
        loop->watcher_queue[1] = w->watcher_queue;
      }
    }
  }
  return;
}

Assistant:

void uv__io_stop(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP)));
  assert(0 != events);

  if (w->fd == -1)
    return;

  assert(w->fd >= 0);

  /* Happens when uv__io_stop() is called on a handle that was never started. */
  if ((unsigned) w->fd >= loop->nwatchers)
    return;

  w->pevents &= ~events;

  if (w->pevents == 0) {
    QUEUE_REMOVE(&w->watcher_queue);
    QUEUE_INIT(&w->watcher_queue);

    if (loop->watchers[w->fd] != NULL) {
      assert(loop->watchers[w->fd] == w);
      assert(loop->nfds > 0);
      loop->watchers[w->fd] = NULL;
      loop->nfds--;
      w->events = 0;
    }
  }
  else if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);
}